

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cavalry.hpp
# Opt level: O0

void __thiscall Cavalry::~Cavalry(Cavalry *this)

{
  Cavalry *this_local;
  
  (this->super_Follower).super_GreenCard.super_Card._vptr_Card =
       (_func_int **)&PTR_effectBonus_0012b6a0;
  std::__cxx11::string::~string((string *)&this->cardText);
  std::__cxx11::string::~string((string *)&this->name);
  Follower::~Follower(&this->super_Follower);
  return;
}

Assistant:

~Cavalry() {}